

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueNameGenerator.cpp
# Opt level: O2

void __thiscall
Assimp::MDL::HalfLife::UniqueNameGenerator::make_unique
          (UniqueNameGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  _Base_ptr p_Var1;
  __type _Var2;
  bool bVar3;
  long lVar4;
  _Base_ptr *pp_Var5;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  pointer pbVar8;
  _Rb_tree_node_base *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  iterator it;
  pointer puVar10;
  size_t i;
  size_t id;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar11;
  ulong local_158;
  UniqueNameGenerator *local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> empty_names_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> template_name_duplicates;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  names_to_duplicates;
  anon_class_8_1_8991fb9c format_name;
  anon_class_24_3_9cb0d701 generate_unique_name;
  DuplicateInfo local_b0;
  string template_name_with_separator;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>
  local_70;
  
  empty_names_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  template_name_duplicates.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_header;
  names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty_names_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_names_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  template_name_duplicates.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  template_name_duplicates.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::operator+(&template_name_with_separator,&this->template_name_,&this->separator_);
  generate_unique_name.format_name = &format_name;
  generate_unique_name.names_to_duplicates = &names_to_duplicates;
  local_158 = 0;
  format_name.this = this;
  generate_unique_name.names = names;
  do {
    pbVar8 = (names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= local_158)
    {
      local_150 = this;
      for (p_Var7 = names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &names_to_duplicates._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        p_Var9 = p_Var7 + 2;
        while (p_Var9 = *(_Rb_tree_node_base **)p_Var9, p_Var9 != p_Var7 + 2) {
          make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0
          ::operator()::string_const___const
                    (&local_70.first,&generate_unique_name,(string *)(p_Var7 + 1));
          std::__cxx11::string::operator=
                    ((string *)
                     ((names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (long)p_Var9->_M_left),
                     (string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
      if (template_name_duplicates.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          template_name_duplicates.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        id = 0;
        for (puVar10 = empty_names_indices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
            puVar10 !=
            empty_names_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
          make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1
          ::operator()::string_const__unsigned_long__const
                    (&local_70.first,&format_name,&local_150->template_name_,id);
          std::__cxx11::string::operator=
                    ((string *)
                     ((names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + *puVar10),(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          id = id + 1;
        }
      }
      else {
        for (puVar10 = empty_names_indices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
            puVar10 !=
            empty_names_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
          make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0
          ::operator()::string_const___const
                    (&local_70.first,&generate_unique_name,&local_150->template_name_);
          std::__cxx11::string::operator=
                    ((string *)
                     ((names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + *puVar10),(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
      std::__cxx11::string::~string((string *)&template_name_with_separator);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
      ::~map(&names_to_duplicates);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&template_name_duplicates.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&empty_names_indices.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    lVar4 = std::__cxx11::string::find_first_not_of((char)pbVar8 + (char)(local_158 << 5),0x20);
    if (lVar4 == -1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&empty_names_indices,&local_158);
    }
    else {
      _Var2 = std::operator==((names->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + local_158,
                              &this->template_name_);
      if (_Var2) {
LAB_00446afa:
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&template_name_duplicates,&local_158);
      }
      else {
        std::__cxx11::string::substr
                  ((ulong)&local_70,
                   (ulong)((names->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + local_158));
        _Var2 = std::operator==(&local_70.first,&template_name_with_separator);
        std::__cxx11::string::~string((string *)&local_70);
        if (_Var2) goto LAB_00446afa;
      }
      __lhs = (names->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + local_158;
      p_Var7 = &names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_header;
      pp_Var5 = &names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      while (p_Var1 = *pp_Var5, (_Rb_tree_header *)p_Var1 != (_Rb_tree_header *)0x0) {
        bVar3 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (p_Var1 + 1),__lhs);
        if (!bVar3) {
          p_Var7 = p_Var1;
        }
        pp_Var5 = &p_Var1->_M_left + bVar3;
      }
      if ((_Rb_tree_header *)p_Var7 == &names_to_duplicates._M_t._M_impl.super__Rb_tree_header) {
        pbVar8 = (names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        bVar3 = std::operator<(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&((_Rb_tree_header *)p_Var7)->_M_node_count);
        pbVar8 = (names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (!bVar3) {
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                    ::operator[](&names_to_duplicates,pbVar8 + local_158);
          std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&this_00->indices,&local_158);
          goto LAB_00446c8b;
        }
      }
      local_b0.indices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      _M_node._M_size = 0;
      local_b0.next_id = 0;
      local_b0.indices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)&local_b0;
      local_b0.indices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      _M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b0;
      std::__cxx11::string::string((string *)&local_70,(string *)(pbVar8 + local_158));
      make_unique::DuplicateInfo::DuplicateInfo(&local_70.second,&local_b0);
      pVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
               ::_M_get_insert_unique_pos(&names_to_duplicates._M_t,&local_70.first);
      p_Var9 = pVar11.second;
      if (p_Var9 != (_Rb_tree_node_base *)0x0) {
        bVar3 = true;
        if (&names_to_duplicates._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var9 &&
            pVar11.first == (_Rb_tree_node_base *)0x0) {
          bVar3 = std::operator<(&local_70.first,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(p_Var9 + 1));
        }
        p_Var6 = (_Rb_tree_node_base *)operator_new(0x60);
        std::__cxx11::string::string((string *)(p_Var6 + 1),(string *)&local_70);
        make_unique::DuplicateInfo::DuplicateInfo((DuplicateInfo *)(p_Var6 + 2),&local_70.second);
        std::_Rb_tree_insert_and_rebalance
                  (bVar3,p_Var6,p_Var9,
                   &names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_header);
        names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count =
             names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>
      ::~pair(&local_70);
      std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
                ((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0);
    }
LAB_00446c8b:
    local_158 = local_158 + 1;
  } while( true );
}

Assistant:

void UniqueNameGenerator::make_unique(std::vector<std::string> &names) {
    struct DuplicateInfo {
        DuplicateInfo() :
            indices(),
            next_id(0) {
        }

        std::list<size_t> indices;
        size_t next_id;
    };

    std::vector<size_t> empty_names_indices;
    std::vector<size_t> template_name_duplicates;
    std::map<std::string, DuplicateInfo> names_to_duplicates;

    const std::string template_name_with_separator(template_name_ + separator_);

    auto format_name = [&](const std::string &base_name, size_t id) -> std::string {
        return base_name + separator_ + std::to_string(id);
    };

    auto generate_unique_name = [&](const std::string &base_name) -> std::string {
        auto *duplicate_info = &names_to_duplicates[base_name];

        std::string new_name = "";

        bool found_identical_name;
        bool tried_with_base_name_only = false;
        do {
            // Assume that no identical name exists.
            found_identical_name = false;

            if (!tried_with_base_name_only) {
                // First try with only the base name.
                new_name = base_name;
            } else {
                // Create the name expected to be unique.
                new_name = format_name(base_name, duplicate_info->next_id);
            }

            // Check in the list of duplicates for an identical name.
            for (size_t i = 0;
                    i < names.size() &&
                    !found_identical_name;
                    ++i) {
                if (new_name == names[i])
                    found_identical_name = true;
            }

            if (tried_with_base_name_only)
                ++duplicate_info->next_id;

            tried_with_base_name_only = true;

        } while (found_identical_name);

        return new_name;
    };

    for (size_t i = 0; i < names.size(); ++i) {
        // Check for empty names.
        if (names[i].find_first_not_of(' ') == std::string::npos) {
            empty_names_indices.push_back(i);
            continue;
        }

        /* Check for potential duplicate.
        a) Either if this name is the same as the template name or
        b) <template name><separator> is found at the beginning. */
        if (names[i] == template_name_ ||
                names[i].substr(0, template_name_with_separator.length()) == template_name_with_separator)
            template_name_duplicates.push_back(i);

        // Map each unique name to it's duplicate.
        if (names_to_duplicates.count(names[i]) == 0)
            names_to_duplicates.insert({ names[i], DuplicateInfo()});
        else
            names_to_duplicates[names[i]].indices.push_back(i);
    }

    // Make every non-empty name unique.
    for (auto it = names_to_duplicates.begin();
            it != names_to_duplicates.end(); ++it) {
        for (auto it2 = it->second.indices.begin();
                it2 != it->second.indices.end();
                ++it2)
            names[*it2] = generate_unique_name(it->first);
    }

    // Generate a unique name for every empty string.
    if (template_name_duplicates.size()) {
        // At least one string ressembles to <template name>.
        for (auto it = empty_names_indices.begin();
                it != empty_names_indices.end(); ++it)
            names[*it] = generate_unique_name(template_name_);
    } else {
        // No string alike <template name> exists.
        size_t i = 0;
        for (auto it = empty_names_indices.begin();
                it != empty_names_indices.end(); ++it, ++i)
            names[*it] = format_name(template_name_, i);
    }
}